

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O3

TrimPositions QStringAlgorithms<const_QByteArray>::trimmed_helper_positions(QByteArray *str)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  TrimPositions TVar4;
  
  pbVar1 = (byte *)(str->d).ptr;
  pbVar2 = pbVar1 + (str->d).size;
  do {
    pbVar3 = pbVar2;
    pbVar2 = pbVar1;
    if (pbVar3 <= pbVar1) goto LAB_00305bfe;
  } while ((pbVar3[-1] < 0x40) &&
          (pbVar2 = pbVar3 + -1, (1L << (pbVar3[-1] & 0x3f) & 0x100003e00U) != 0));
  while (pbVar2 = pbVar1, *pbVar1 < 0x40) {
    if (((1L << (*pbVar1 & 0x3f) & 0x100003e00U) == 0) ||
       (pbVar1 = pbVar1 + 1, pbVar2 = pbVar3, pbVar3 <= pbVar1)) break;
  }
LAB_00305bfe:
  TVar4.end = (Char *)pbVar3;
  TVar4.begin = (Char *)pbVar2;
  return TVar4;
}

Assistant:

[[nodiscard]] static TrimPositions trimmed_helper_positions(const StringType &str)
    {
        const Char *begin = str.cbegin();
        const Char *end = str.cend();
        // skip white space from end
        while (begin < end && isSpace(end[-1]))
            --end;
        // skip white space from start
        while (begin < end && isSpace(*begin))
            begin++;
        return {begin, end};
    }